

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

ssize_t __thiscall phpconvert::ZendParser::write(ZendParser *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  reference pFVar2;
  DirectoryReader *pDVar3;
  pointer pFVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
  local_170;
  File *local_168;
  __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
  local_160;
  iterator file;
  File fileCopy;
  int *generated_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmpSet_local;
  ZendParser *this_local;
  
  *(undefined4 *)__buf = 0;
  fileCopy.prepTypesMain.
  super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__buf;
  BaseParser::File::File((File *)&file);
  __gnu_cxx::
  __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
  ::__normal_iterator(&local_160);
  local_168 = (File *)std::
                      vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                      ::begin(this->results);
  local_160._M_current = local_168;
  while( true ) {
    local_170._M_current =
         (File *)std::
                 vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
                 ::end(this->results);
    bVar1 = __gnu_cxx::operator!=(&local_160,&local_170);
    if (!bVar1) break;
    pFVar2 = __gnu_cxx::
             __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
             ::operator*(&local_160);
    BaseParser::File::operator=((File *)&file,pFVar2);
    pDVar3 = getReader(this);
    DirectoryReader::getDirectorySeparator_abi_cxx11_();
    std::operator+(&local_1c0,&(this->super_BaseParser).outputDir,&local_1e0);
    pFVar4 = __gnu_cxx::
             __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
             ::operator->(&local_160);
    std::operator+(&local_1a0,&local_1c0,&pFVar4->rootPath);
    DirectoryReader::createDir(pDVar3,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    replaceTypesBuiltIn(this,(File *)&file);
    replaceTypesGlobal(this,(File *)&file);
    addNamespace(this,(File *)&file);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_210,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_register_00000034,__fd));
    addUsages(this,(File *)&file,&local_210);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_210);
    replaceTypes(this,(File *)&file);
    pDVar3 = getReader(this);
    DirectoryReader::getDirectorySeparator_abi_cxx11_();
    std::operator+(&local_270,&(this->super_BaseParser).outputDir,&local_290);
    std::operator+(&local_250,&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fileCopy.fullPath.field_2 + 8));
    std::operator+(&local_230,&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    DirectoryReader::writeTextFile
              (pDVar3,&local_230,(string *)((long)&fileCopy.firstMainTypeFull.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    *(int *)&(fileCopy.prepTypesMain.
              super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)->type =
         *(int *)&(fileCopy.prepTypesMain.
                   super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->type + 1;
    __gnu_cxx::
    __normal_iterator<phpconvert::BaseParser::File_*,_std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>_>
    ::operator++(&local_160);
  }
  BaseParser::File::~File((File *)&file);
  return extraout_RAX;
}

Assistant:

void ZendParser::write(const set<string> &tmpSet, int &generated) {
        generated = 0;
        File fileCopy;
        vector<ZendParser::File>::iterator file;
        for (file = results->begin(); file != results->end(); ++file) {
//            if (file->name.compare("View.php") != 0) {
//                if (file->name.compare("Interface.php") != 0) {
//                    if (file->name.compare("Exception.php") != 0) {
//                        continue;
//                    }
//                }
//            }
//            else if (file->name.compare("Interface.php") != 0) {
//            }
//            else if (file->name.compare("Exception.php") != 0) {
//            }
//            else {
//                continue;
//            }

//		if (file->name.compare("Role.php") != 0) {
//			continue;
//		}
//        if (file->name.compare("Registry.php")) {
//            continue;
//        }
//		if (file->name.compare("Exception.php")!=0) {
//			continue;
//		}
//		if (file->name.compare("Initializer.php")) {
//			continue;
//		}
//		if (file->name.compare("Select.php")) {
//			continue;
//		}
            fileCopy = *file;
            getReader()->createDir(outputDir + DirectoryReader::getDirectorySeparator() + file->rootPath);
            replaceTypesBuiltIn(fileCopy); //@todo problem here
            replaceTypesGlobal(fileCopy);
//		cout << fileCopy.mainType << "\n";
//            if (fileCopy.mainType.length() > 0) {

                addNamespace(fileCopy);
                addUsages(fileCopy, tmpSet);
                replaceTypes(fileCopy);
//            }


            getReader()->writeTextFile(
                    outputDir + DirectoryReader::getDirectorySeparator() + fileCopy.rootPath + fileCopy.name,
                    fileCopy.content);
            generated++;
        }
    }